

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_batch_collector.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalArrowBatchCollector::Finalize
          (PhysicalArrowBatchCollector *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  StatementProperties *args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *args_2;
  GlobalSinkState *pGVar1;
  pointer pIVar2;
  element_type *peVar3;
  idx_t iVar4;
  pointer this_00;
  ArrowQueryResult *__args;
  StatementType *args;
  shared_ptr<duckdb::ArrowMergeEvent,_true> new_event;
  undefined1 local_a9;
  shared_ptr<duckdb::ArrowMergeEvent,_true> local_a8;
  vector<duckdb::LogicalType,_true> *local_98;
  BatchedDataCollection *local_90;
  Pipeline *local_88;
  Event *local_80;
  ClientProperties local_78;
  shared_ptr<duckdb::Event,_true> local_48;
  
  pGVar1 = input->global_state;
  local_90 = (BatchedDataCollection *)
             &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
  ;
  local_88 = pipeline;
  local_80 = event;
  iVar4 = BatchedDataCollection::Count(local_90);
  args = &(this->super_PhysicalBatchCollector).super_PhysicalResultCollector.statement_type;
  args_1 = &(this->super_PhysicalBatchCollector).super_PhysicalResultCollector.properties;
  args_2 = &(this->super_PhysicalBatchCollector).super_PhysicalResultCollector.names;
  local_98 = &(this->super_PhysicalBatchCollector).super_PhysicalResultCollector.
              super_PhysicalOperator.types;
  if (iVar4 == 0) {
    ClientContext::GetClientProperties(&local_78,context);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              ((duckdb *)&local_a8,args,args_1,args_2,local_98,&local_78,&this->record_batch_size);
    peVar3 = local_a8.internal.
             super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    pIVar2 = pGVar1[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar1[3].super_StateWithBlockableTasks.blocked_tasks.
    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
    super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)peVar3;
    if (pIVar2 != (pointer)0x0) {
      (**(code **)(*(long *)pIVar2 + 8))();
      if (local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (*((local_a8.internal.
            super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_BasePipelineEvent).super_Event._vptr_Event[1])();
      }
    }
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.time_zone._M_dataplus._M_p != &local_78.time_zone.field_2) {
      operator_delete(local_78.time_zone._M_dataplus._M_p);
    }
  }
  else {
    ClientContext::GetClientProperties(&local_78,context);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              ((duckdb *)&local_a8,args,args_1,args_2,local_98,&local_78,&this->record_batch_size);
    peVar3 = local_a8.internal.
             super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    pIVar2 = pGVar1[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar1[3].super_StateWithBlockableTasks.blocked_tasks.
    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
    super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)peVar3;
    if (pIVar2 != (pointer)0x0) {
      (**(code **)(*(long *)pIVar2 + 8))();
      if (local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (*((local_a8.internal.
            super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_BasePipelineEvent).super_Event._vptr_Event[1])();
      }
    }
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.time_zone._M_dataplus._M_p != &local_78.time_zone.field_2) {
      operator_delete(local_78.time_zone._M_dataplus._M_p);
    }
    this_00 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
              operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)&pGVar1[3].super_StateWithBlockableTasks.blocked_tasks);
    __args = QueryResult::Cast<duckdb::ArrowQueryResult>(this_00);
    local_78.time_zone._M_dataplus._M_p = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ArrowMergeEvent,std::allocator<duckdb::ArrowMergeEvent>,duckdb::ArrowQueryResult&,duckdb::BatchedDataCollection&,duckdb::Pipeline&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.time_zone._M_string_length,
               (ArrowMergeEvent **)&local_78,(allocator<duckdb::ArrowMergeEvent> *)&local_a9,__args,
               local_90,local_88);
    shared_ptr<duckdb::ArrowMergeEvent,_true>::shared_ptr
              (&local_a8,(shared_ptr<duckdb::ArrowMergeEvent> *)&local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.time_zone._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.time_zone._M_string_length
                );
    }
    local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_a8.internal.
            super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Event::InsertEvent(local_80,&local_48);
    if (local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a8.internal.super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.internal.
                 super___shared_ptr<duckdb::ArrowMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalArrowBatchCollector::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                       OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<ArrowBatchGlobalState>();

	auto total_tuple_count = gstate.data.Count();
	if (total_tuple_count == 0) {
		// Create the result containing a single empty result conversion
		gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types,
		                                            context.GetClientProperties(), record_batch_size);
		return SinkFinalizeType::READY;
	}

	// Already create the final query result
	gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types, context.GetClientProperties(),
	                                            record_batch_size);
	// Spawn an event that will populate the conversion result
	auto &arrow_result = gstate.result->Cast<ArrowQueryResult>();
	auto new_event = make_shared_ptr<ArrowMergeEvent>(arrow_result, gstate.data, pipeline);
	event.InsertEvent(std::move(new_event));

	return SinkFinalizeType::READY;
}